

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O0

void __thiscall
agg::pod_bvector<agg::point_base<double>,_6U>::add
          (pod_bvector<agg::point_base<double>,_6U> *this,point_base<double> *val)

{
  point_base<double> *ppVar1;
  point_base<double> *val_local;
  pod_bvector<agg::point_base<double>,_6U> *this_local;
  
  ppVar1 = data_ptr(this);
  ppVar1->x = val->x;
  ppVar1->y = val->y;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void pod_bvector<T, S>::add(const T& val)
    {
        *data_ptr() = val;
        ++m_size;
    }